

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O0

void greatest_buffer_test_name(char *name)

{
  size_t sVar1;
  size_t size;
  size_t len;
  greatest_run_info *g;
  char *name_local;
  
  sVar1 = strlen(name);
  memset(greatest_info.name_buf,0,0x80);
  strncat(greatest_info.name_buf,name,0x7f);
  if ((greatest_info.name_suffix != (char *)0x0) && (sVar1 + 1 < 0x80)) {
    greatest_info.name_buf[sVar1] = '_';
    strncat(greatest_info.name_buf + sVar1 + 1,greatest_info.name_suffix,0x80 - (sVar1 + 2));
  }
  return;
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}